

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryReporterPlugin_newArrayAllocationsAreReportedTest_Test::testBody
          (TEST_MemoryReporterPlugin_newArrayAllocationsAreReportedTest_Test *this)

{
  MemoryReporterPluginUnderTest *pMVar1;
  int iVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  MockExpectedCall *pMVar4;
  MemoryReportAllocator *pMVar5;
  undefined4 extraout_var_00;
  TestMemoryAllocator *pTVar6;
  undefined4 extraout_var_01;
  char *memory;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MemoryReporterPlugin_newArrayAllocationsAreReportedTest_Test *local_10;
  TEST_MemoryReporterPlugin_newArrayAllocationsAreReportedTest_Test *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"formatter");
  pMVar3 = mock(&local_20,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_40,"report_alloc_memory");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,local_40);
  SimpleString::SimpleString(&local_50,"result");
  pMVar4 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var,iVar2),&local_50,
                      (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).result);
  SimpleString::SimpleString(&local_60,"TestMemoryAllocator");
  SimpleString::SimpleString(&local_70,"allocator");
  pMVar5 = MemoryReporterPlugin::getNewArrayAllocator
                     (&((this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).reporter)->
                       super_MemoryReporterPlugin);
  (*pMVar4->_vptr_MockExpectedCall[5])(pMVar4,&local_60,&local_70,pMVar5);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(local_40);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_80,"formatter");
  pMVar3 = mock(&local_80,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"report_free_memory");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_90);
  SimpleString::SimpleString(&local_a0,"result");
  pMVar4 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var_00,iVar2),&local_a0,
                      (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).result);
  SimpleString::SimpleString(&local_b0,"TestMemoryAllocator");
  SimpleString::SimpleString(&local_c0,"allocator");
  pMVar5 = MemoryReporterPlugin::getNewArrayAllocator
                     (&((this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).reporter)->
                       super_MemoryReporterPlugin);
  (*pMVar4->_vptr_MockExpectedCall[5])(pMVar4,&local_b0,&local_c0,pMVar5);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  SimpleString::SimpleString((SimpleString *)&memory,"formatter");
  pMVar3 = mock((SimpleString *)&memory,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x24])();
  SimpleString::~SimpleString((SimpleString *)&memory);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).reporter;
  (*(pMVar1->super_MemoryReporterPlugin).super_TestPlugin._vptr_TestPlugin[2])
            (pMVar1,(this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).test,
             (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).result);
  pTVar6 = getCurrentNewArrayAllocator();
  iVar2 = (*pTVar6->_vptr_TestMemoryAllocator[8])(pTVar6,100);
  pTVar6 = getCurrentNewArrayAllocator();
  (*pTVar6->_vptr_TestMemoryAllocator[3])(pTVar6,CONCAT44(extraout_var_01,iVar2),100,"unknown",1);
  return;
}

Assistant:

TEST(MemoryReporterPlugin, newArrayAllocationsAreReportedTest)
{
    mock("formatter").expectOneCall("report_alloc_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getNewArrayAllocator());
    mock("formatter").expectOneCall("report_free_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getNewArrayAllocator());
    mock("formatter").ignoreOtherCalls();

    reporter->preTestAction(*test, *result);
    char *memory = getCurrentNewArrayAllocator()->allocMemoryLeakNode(100);
    getCurrentNewArrayAllocator()->free_memory(memory, 100, "unknown", 1);
}